

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
ModbusSimulationDataGenerator::SendWriteMultipleCoilsRequest
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U16 StartingAddress,U16 Quantity,
          U8 ByteCount,U8 *Values)

{
  int iVar1;
  char cVar2;
  U16 UVar3;
  ushort uVar4;
  int local_38;
  int local_34;
  int i_3;
  int i_2;
  U16 LRCvalue;
  int i_1;
  U16 CRCValue;
  int i;
  U8 *Values_local;
  U8 ByteCount_local;
  U16 Quantity_local;
  U16 StartingAddress_local;
  U8 DeviceID_local;
  ModbusSimulationDataGenerator *this_local;
  
  iVar1 = (int)this;
  if (this->mSettings->mModbusMode == ModbusRTUClient) {
    CreateModbusByte(this,(ulong)DeviceID);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0xf);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)(int)(StartingAddress & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)((int)(StartingAddress & 0xff00) >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)(int)(Quantity & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)((int)(Quantity & 0xff00) >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(ulong)ByteCount);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    for (i_1 = 0; i_1 < (int)(uint)ByteCount; i_1 = i_1 + 1) {
      CreateModbusByte(this,(ulong)Values[i_1]);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    }
    UVar3 = update_CRC(this,0xffff,DeviceID);
    UVar3 = update_CRC(this,UVar3,'\x0f');
    UVar3 = update_CRC(this,UVar3,(U8)StartingAddress);
    UVar3 = update_CRC(this,UVar3,(U8)(StartingAddress >> 8));
    UVar3 = update_CRC(this,UVar3,(U8)Quantity);
    UVar3 = update_CRC(this,UVar3,(U8)(Quantity >> 8));
    LRCvalue = update_CRC(this,UVar3,ByteCount);
    for (i_2 = 0; i_2 < (int)(uint)ByteCount; i_2 = i_2 + 1) {
      LRCvalue = update_CRC(this,LRCvalue,Values[i_2]);
    }
    CreateModbusByte(this,(long)(int)(LRCvalue & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)((int)(LRCvalue & 0xff00) >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  else {
    i_3._2_2_ = DeviceID + 0xf + (StartingAddress & 0xff) + (StartingAddress >> 8) +
                (Quantity & 0xff) + (Quantity >> 8) + (ushort)ByteCount;
    for (local_34 = 0; local_34 < (int)(uint)ByteCount; local_34 = local_34 + 1) {
      i_3._2_2_ = i_3._2_2_ + Values[local_34];
    }
    uVar4 = (i_3._2_2_ ^ 0xffff) + 1;
    CreateModbusByte(this,0x3a);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(uint)DeviceID >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,DeviceID & 0xf);
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0x30);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0x46);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(StartingAddress & 0xf000) >> 0xc));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((StartingAddress & 0xf0f) >> 8));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(StartingAddress & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)(StartingAddress & 0xf0f));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(Quantity & 0xf000) >> 0xc));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((Quantity & 0xf0f) >> 8));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(Quantity & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)(Quantity & 0xf0f));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(ByteCount & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,ByteCount & 0xf);
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    for (local_38 = 0; local_38 < (int)(uint)ByteCount; local_38 = local_38 + 1) {
      cVar2 = BinToLATIN1(this,(U8)((int)(Values[local_38] & 0xf0) >> 4));
      CreateModbusByte(this,(long)cVar2);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptor::Advance(iVar1 + 0x30);
      cVar2 = BinToLATIN1(this,Values[local_38] & 0xf);
      CreateModbusByte(this,(long)cVar2);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    }
    cVar2 = BinToLATIN1(this,(U8)((int)((uVar4 & 0xff) & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(byte)uVar4 & 0xf);
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,10);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendWriteMultipleCoilsRequest( U8 DeviceID, U16 StartingAddress, U16 Quantity, U8 ByteCount,
                                                                   U8 Values[] )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUClient )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( 0x0F );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( StartingAddress & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( StartingAddress & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( Quantity & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( Quantity & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ByteCount );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        for( int i = 0; i < ByteCount; i++ )
        {
            CreateModbusByte( Values[ i ] );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
        }

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, 0x0F );
        CRCValue = update_CRC( CRCValue, StartingAddress & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( StartingAddress & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, Quantity & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( Quantity & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, ByteCount );

        for( int i = 0; i < ByteCount; i++ )
        {
            CRCValue = update_CRC( CRCValue, Values[ i ] );
        }

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + 0x0F;
        LRCvalue = LRCvalue + ( StartingAddress & 0x00FF );
        LRCvalue = LRCvalue + ( ( StartingAddress & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + ( Quantity & 0x00FF );
        LRCvalue = LRCvalue + ( ( Quantity & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + ByteCount;

        for( int i = 0; i < ByteCount; i++ )
        {
            LRCvalue = LRCvalue + Values[ i ];
        }

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '0' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( 'F' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( StartingAddress & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( StartingAddress & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( StartingAddress & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( StartingAddress & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( Quantity & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( Quantity & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( Quantity & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( Quantity & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( ByteCount & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ByteCount & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        for( int i = 0; i < ByteCount; i++ )
        {
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0xF0 ) >> 4 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( Values[ i ] & 0xF ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        }

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}